

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O2

bool auto_check_multi(DESCRIPTOR_DATA *d_check,char *host)

{
  bool bVar1;
  DESCRIPTOR_DATA **ppDVar2;
  
  ppDVar2 = &descriptor_list;
  do {
    do {
      ppDVar2 = &((DESCRIPTOR_DATA *)ppDVar2)->next->next;
      if ((DESCRIPTOR_DATA *)ppDVar2 == (DESCRIPTOR_DATA *)0x0) goto LAB_0032182e;
    } while (((DESCRIPTOR_DATA *)ppDVar2 == d_check) ||
            (((DESCRIPTOR_DATA *)ppDVar2)->character == (CHAR_DATA *)0x0));
    bVar1 = str_cmp(host,((DESCRIPTOR_DATA *)ppDVar2)->host);
  } while (bVar1);
LAB_0032182e:
  return (DESCRIPTOR_DATA *)ppDVar2 != (DESCRIPTOR_DATA *)0x0;
}

Assistant:

bool auto_check_multi(DESCRIPTOR_DATA *d_check, char *host)
{
	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == d_check || d->character == nullptr)
			continue;

		if (!str_cmp(host, d->host))
			return true;
	}

	return false;
}